

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

opj_codestream_index_t * j2k_create_cstr_index(void)

{
  opj_marker_info_t *poVar1;
  opj_codestream_index_t *cstr_index;
  opj_codestream_index_t *local_8;
  
  local_8 = (opj_codestream_index_t *)calloc(1,0x38);
  if (local_8 == (opj_codestream_index_t *)0x0) {
    local_8 = (opj_codestream_index_t *)0x0;
  }
  else {
    local_8->maxmarknum = 100;
    local_8->marknum = 0;
    poVar1 = (opj_marker_info_t *)calloc((ulong)local_8->maxmarknum,0x18);
    local_8->marker = poVar1;
    if (local_8->marker == (opj_marker_info_t *)0x0) {
      local_8 = (opj_codestream_index_t *)0x0;
    }
    else {
      local_8->tile_index = (opj_tile_index_t *)0x0;
    }
  }
  return local_8;
}

Assistant:

opj_codestream_index_t* j2k_create_cstr_index(void)
{
	opj_codestream_index_t* cstr_index = (opj_codestream_index_t*)
			opj_calloc(1,sizeof(opj_codestream_index_t));
	if (!cstr_index)
		return NULL;

	cstr_index->maxmarknum = 100;
	cstr_index->marknum = 0;
	cstr_index->marker = (opj_marker_info_t*)
			opj_calloc(cstr_index->maxmarknum, sizeof(opj_marker_info_t));
	if (!cstr_index-> marker)
		return NULL;

	cstr_index->tile_index = NULL;

	return cstr_index;
}